

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::framebufferTextureLayer
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 texture,int level,
          int layer)

{
  _Rb_tree_header *p_Var1;
  Framebuffer *pFVar2;
  Attachment *pAVar3;
  long lVar4;
  TexTarget TVar5;
  Framebuffer *pFVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  int iVar9;
  int iVar10;
  AttachmentType *attachment_00;
  bool bVar11;
  
  if ((int)attachment < 0x8d00) {
    if (attachment == 0x821a) {
      (*(this->super_Context)._vptr_Context[0x1f])
                (this,(ulong)target,0x8d00,(ulong)texture,(ulong)(uint)level,layer);
      (*(this->super_Context)._vptr_Context[0x1f])
                (this,(ulong)target,0x8d20,(ulong)texture,(ulong)(uint)level,layer);
      return;
    }
    if (attachment == 0x8ce0) {
      bVar11 = false;
      lVar4 = 0;
    }
    else {
LAB_00988a87:
      lVar4 = 3;
      bVar11 = true;
    }
  }
  else {
    if (attachment == 0x8d00) {
      lVar4 = 1;
    }
    else {
      if (attachment != 0x8d20) goto LAB_00988a87;
      lVar4 = 2;
    }
    bVar11 = false;
  }
  if (((1 < target - 0x8ca8) && (target != 0x8d40)) || (bVar11)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  pFVar2 = this->m_drawFramebufferBinding;
  pFVar6 = this->m_readFramebufferBinding;
  if (target == 0x8ca9) {
    pFVar6 = pFVar2;
  }
  if (target == 0x8d40) {
    pFVar6 = pFVar2;
  }
  if (pFVar6 != (Framebuffer *)0x0) {
    if (texture == 0) {
      p_Var8 = (_Base_ptr)0x0;
LAB_00988bdb:
      pAVar3 = pFVar6->m_attachments + lVar4;
      attachment_00 = &pAVar3->type;
      iVar10 = (uint)(pFVar6 == this->m_readFramebufferBinding) + (uint)(pFVar6 == pFVar2);
      for (iVar9 = iVar10; iVar9 != 0; iVar9 = iVar9 + -1) {
        releaseFboAttachmentReference(this,(Attachment *)attachment_00);
      }
      pAVar3->type = ATTACHMENTTYPE_LAST;
      pAVar3->name = 0;
      pFVar6->m_attachments[lVar4].texTarget = TEXTARGET_LAST;
      pFVar6->m_attachments[lVar4].level = 0;
      pFVar6->m_attachments[lVar4].layer = 0;
      if (p_Var8 == (_Base_ptr)0x0) {
        return;
      }
      *attachment_00 = ATTACHMENTTYPE_TEXTURE;
      pFVar6->m_attachments[lVar4].name = *(deUint32 *)&p_Var8->_M_parent;
      TVar5 = TEXTARGET_LAST;
      if (*(int *)&p_Var8->_M_left - 3U < 3) {
        TVar5 = *(int *)&p_Var8->_M_left + TEXTARGET_CUBE_MAP_NEGATIVE_X;
      }
      pFVar6->m_attachments[lVar4].texTarget = TVar5;
      pFVar6->m_attachments[lVar4].level = level;
      pFVar6->m_attachments[lVar4].layer = layer;
      for (; iVar10 != 0; iVar10 = iVar10 + -1) {
        acquireFboAttachmentReference(this,(Attachment *)attachment_00);
      }
      return;
    }
    p_Var8 = (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var8 != (_Base_ptr)0x0) {
      p_Var1 = &(this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = &p_Var1->_M_header;
      do {
        bVar11 = p_Var8[1]._M_color < texture;
        if (!bVar11) {
          p_Var7 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[bVar11];
      } while (p_Var8 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var7[1]._M_color <= texture)) &&
         (p_Var8 = p_Var7[1]._M_parent, p_Var8 != (_Base_ptr)0x0)) {
        if (level == 0) {
          iVar9 = *(int *)&p_Var8->_M_left;
          if (iVar9 != 3) {
            if (iVar9 == 4) {
              if ((uint)layer < 0x8073) goto LAB_00988bdb;
              goto LAB_00988bbc;
            }
            if (iVar9 != 5) goto LAB_00988c91;
          }
          if ((uint)layer < 0x88ff) goto LAB_00988bdb;
        }
LAB_00988bbc:
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x501;
        return;
      }
    }
  }
LAB_00988c91:
  if (this->m_lastError == 0) {
    this->m_lastError = 0x502;
  }
  return;
}

Assistant:

void ReferenceContext::framebufferTextureLayer (deUint32 target, deUint32 attachment, deUint32 texture, int level, int layer)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach to both depth and stencil.
		framebufferTextureLayer(target, GL_DEPTH_ATTACHMENT,	texture, level, layer);
		framebufferTextureLayer(target, GL_STENCIL_ATTACHMENT,	texture, level, layer);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Texture*						texObj			= DE_NULL;

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (texture != 0)
		{
			texObj = m_textures.find(texture);

			RC_IF_ERROR(!texObj,		GL_INVALID_OPERATION,	RC_RET_VOID);
			RC_IF_ERROR(level != 0,		GL_INVALID_VALUE,		RC_RET_VOID); // \todo [2012-03-19 pyry] We should allow other levels as well.

			RC_IF_ERROR(texObj->getType() != Texture::TYPE_2D_ARRAY			&&
						texObj->getType() != Texture::TYPE_3D				&&
						texObj->getType() != Texture::TYPE_CUBE_MAP_ARRAY,				GL_INVALID_OPERATION,	RC_RET_VOID);

			if (texObj->getType() == Texture::TYPE_2D_ARRAY || texObj->getType() == Texture::TYPE_CUBE_MAP_ARRAY)
			{
				RC_IF_ERROR((layer < 0) || (layer >= GL_MAX_ARRAY_TEXTURE_LAYERS),		GL_INVALID_VALUE,		RC_RET_VOID);
				RC_IF_ERROR((level < 0) || (level > deFloatLog2(GL_MAX_TEXTURE_SIZE)),	GL_INVALID_VALUE,		RC_RET_VOID);
			}
			else if	(texObj->getType() == Texture::TYPE_3D)
			{
				RC_IF_ERROR((layer < 0) || (layer >= GL_MAX_3D_TEXTURE_SIZE),				GL_INVALID_VALUE,		RC_RET_VOID);
				RC_IF_ERROR((level < 0) || (level > deFloatLog2(GL_MAX_3D_TEXTURE_SIZE)),	GL_INVALID_VALUE,		RC_RET_VOID);
			}
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (texObj)
		{
			fboAttachment.type			= Framebuffer::ATTACHMENTTYPE_TEXTURE;
			fboAttachment.name			= texObj->getName();
			fboAttachment.texTarget		= texLayeredTypeToTarget(texObj->getType());
			fboAttachment.level			= level;
			fboAttachment.layer			= layer;

			DE_ASSERT(fboAttachment.texTarget != Framebuffer::TEXTARGET_LAST);

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}